

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

float cimg_library::CImg<float>::_cimg_lanczos(float x)

{
  float fVar1;
  float fVar2;
  float __x;
  
  fVar1 = 0.0;
  if (ABS(x) < 2.0) {
    if ((x == 0.0) && (!NAN(x))) {
      return 1.0;
    }
    __x = x * 3.1415927;
    fVar1 = sinf(__x);
    fVar2 = sinf(__x * 0.5);
    fVar1 = (fVar2 * fVar1) / (__x * 0.5 * __x);
  }
  return fVar1;
}

Assistant:

static float _cimg_lanczos(const float x) {
      if (x<=-2 || x>=2) return 0;
      const float a = (float)cimg::PI*x, b = 0.5f*a;
      return (float)(x?std::sin(a)*std::sin(b)/(a*b):1);
    }